

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

bool r_exec::gtr(Context *context,uint16_t *index)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  Atom *pAVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  Atom local_40 [4];
  float local_3c;
  Atom local_38 [4];
  Atom local_34 [4];
  long *plVar4;
  
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  cVar1 = r_code::Atom::isFloat();
  if (cVar1 == '\0') {
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x39) {
      (**(code **)(*plVar6 + 0x20))(plVar6,0);
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x39) {
        pAVar7 = (Atom *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
        uVar8 = r_code::Utils::GetTimestamp(pAVar7);
        pAVar7 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        uVar9 = r_code::Utils::GetTimestamp(pAVar7);
        bVar10 = uVar9 < uVar8;
        pAVar7 = local_38;
        r_code::Atom::Boolean(SUB81(pAVar7,0));
        uVar2 = Context::setAtomicResult(context,pAVar7);
        goto LAB_0018d3c4;
      }
    }
LAB_0018d3d2:
    r_code::Atom::UndefinedBoolean();
    uVar2 = Context::setAtomicResult(context,local_40);
    *index = uVar2;
    r_code::Atom::~Atom(local_40);
    bVar10 = false;
    if (plVar6 == (long *)0x0) goto LAB_0018d407;
  }
  else {
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar1 = r_code::Atom::isFloat();
    if (cVar1 == '\0') goto LAB_0018d3d2;
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    local_3c = (float)r_code::Atom::asFloat();
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    fVar11 = (float)r_code::Atom::asFloat();
    bVar10 = fVar11 < local_3c;
    pAVar7 = local_34;
    r_code::Atom::Boolean(SUB81(pAVar7,0));
    uVar2 = Context::setAtomicResult(context,pAVar7);
LAB_0018d3c4:
    *index = uVar2;
    r_code::Atom::~Atom(pAVar7);
  }
  (**(code **)(*plVar6 + 8))(plVar6);
LAB_0018d407:
  (**(code **)(*plVar5 + 8))(plVar5);
  return bVar10;
}

Assistant:

bool gtr(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            bool r = lhs[0].asFloat() > rhs[0].asFloat();
            index = context.setAtomicResult(Atom::Boolean(r));
            return r;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            bool r = Utils::GetTimestamp(&lhs[0]) > Utils::GetTimestamp(&rhs[0]);
            index = context.setAtomicResult(Atom::Boolean(r));
            return r;
        }
    }

    index = context.setAtomicResult(Atom::UndefinedBoolean());
    return false;
}